

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRect(ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col,float rounding,
                   ImDrawCornerFlags rounding_corners,float thickness)

{
  uint in_ECX;
  undefined8 in_RDX;
  ImVec2 *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  uint in_XMM0_Da;
  ImVec2 b;
  undefined4 in_XMM1_Da;
  ImVec2 *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  ImVec2 *this_00;
  float thickness_00;
  undefined8 in_stack_ffffffffffffff58;
  ImDrawList *in_stack_ffffffffffffff60;
  undefined1 local_68 [24];
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  ImDrawListSharedData *in_stack_ffffffffffffffd0;
  
  thickness_00 = (float)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  if ((in_ECX & 0xff000000) != 0) {
    if ((*(uint *)(in_RDI + 0x30) & 1) == 0) {
      this_00 = (ImVec2 *)(local_68 + 0x10);
      ImVec2::ImVec2(this_00,0.5,0.5);
      thickness_00 = (float)((ulong)this_00 >> 0x20);
      local_50 = ::operator+(in_RSI,(ImVec2 *)0x2167c9);
      in_stack_ffffffffffffff60 = (ImDrawList *)local_68;
      ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff60,0.49,0.49);
      local_68._8_8_ = ::operator-(in_RSI,(ImVec2 *)0x216805);
      PathRect((ImDrawList *)CONCAT44(in_ECX,in_XMM0_Da),(ImVec2 *)CONCAT44(in_R8D,in_XMM1_Da),
               &in_stack_ffffffffffffffd0->TexUvWhitePixel,in_stack_ffffffffffffffcc,
               (ImDrawCornerFlags)in_stack_ffffffffffffffc8);
    }
    else {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,0.5,0.5);
      b = ::operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x216726);
      ImVec2::ImVec2(&local_48,0.5,0.5);
      local_40 = ::operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x216763);
      PathRect((ImDrawList *)CONCAT44(in_ECX,in_XMM0_Da),(ImVec2 *)CONCAT44(in_R8D,in_XMM1_Da),
               (ImVec2 *)b,in_stack_ffffffffffffffcc,(ImDrawCornerFlags)in_stack_ffffffffffffffc8);
      in_RDX = in_stack_ffffffffffffff58;
    }
    PathStroke(in_stack_ffffffffffffff60,(ImU32)((ulong)in_RDX >> 0x20),
               SUB81((ulong)in_RDX >> 0x18,0),thickness_00);
  }
  return;
}

Assistant:

void ImDrawList::AddRect(const ImVec2& p_min, const ImVec2& p_max, ImU32 col, float rounding, ImDrawCornerFlags rounding_corners, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
        PathRect(p_min + ImVec2(0.50f,0.50f), p_max - ImVec2(0.50f,0.50f), rounding, rounding_corners);
    else
        PathRect(p_min + ImVec2(0.50f,0.50f), p_max - ImVec2(0.49f,0.49f), rounding, rounding_corners); // Better looking lower-right corner and rounded non-AA shapes.
    PathStroke(col, true, thickness);
}